

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O0

void * log_map_get(log_map map,char *key)

{
  undefined8 *puVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *in_RSI;
  long *in_RDI;
  log_map_bucket_conflict bucket;
  size_t hash;
  
  sVar3 = log_map_hash_fnv1(in_RSI);
  puVar4 = (undefined8 *)(*in_RDI + (sVar3 & in_RDI[2] - 1U) * 0x18);
  puVar1 = (undefined8 *)*puVar4;
  while( true ) {
    if (puVar1 == (undefined8 *)0x0) {
      return (void *)0x0;
    }
    iVar2 = strcmp((char *)*puVar4,in_RSI);
    if (iVar2 == 0) break;
    puVar4 = (undefined8 *)puVar4[2];
    puVar1 = puVar4;
  }
  return (void *)puVar4[1];
}

Assistant:

const void *log_map_get(log_map map, const char *key)
{
	size_t hash = log_map_hash_fnv1(key) & (map->table.size - 1);

	log_map_bucket bucket = &map->table.data[hash];

	if (bucket->key != NULL)
	{
		do
		{
			if (strcmp(bucket->key, key) == 0)
			{
				return bucket->value;
			}

			bucket = bucket->next;

		} while (bucket != NULL);
	}

	return NULL;
}